

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

int Abc_NtkLatchIsSelfFeed(Abc_Obj_t *pLatch)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  uint uVar4;
  
  if ((*(uint *)&pLatch->field_0x14 & 0xf) != 8) {
    __assert_fail("Abc_ObjIsLatch(pLatch)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLatch.c"
                  ,0x4a,"int Abc_NtkLatchIsSelfFeed(Abc_Obj_t *)");
  }
  plVar2 = (long *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanins).pArray];
  plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
  if (((*(uint *)((long)plVar2 + 0x14) & 0xf) != 5) ||
     (pAVar3 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8),
     (*(uint *)&pAVar3->field_0x14 & 0xf) != 8)) {
    return 0;
  }
  uVar4 = *(uint *)&pAVar3->field_0x14;
  do {
    if ((uVar4 & 0xf) != 8) {
      __assert_fail("Abc_ObjIsLatch(pLatch)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLatch.c"
                    ,0x33,"int Abc_NtkLatchIsSelfFeed_rec(Abc_Obj_t *, Abc_Obj_t *)");
    }
    if (pAVar3 == pLatch) {
      return 1;
    }
    plVar2 = (long *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
    plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
    if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 5) {
      return 0;
    }
    pAVar1 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8)
    ;
    uVar4 = *(uint *)&pAVar1->field_0x14;
    pLatch = pAVar3;
    pAVar3 = pAVar1;
  } while ((uVar4 & 0xf) == 8);
  return 0;
}

Assistant:

static inline int         Abc_ObjIsLatch( Abc_Obj_t * pObj )         { return pObj->Type == ABC_OBJ_LATCH;   }